

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SchemaValidator::SchemaValidator
          (SchemaValidator *this,XMLErrorReporter *errReporter,MemoryManager *manager)

{
  MemoryManager *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *pVVar3;
  undefined4 extraout_var_00;
  
  XMLValidator::XMLValidator(&this->super_XMLValidator,errReporter);
  (this->super_XMLValidator)._vptr_XMLValidator = (_func_int **)&PTR__SchemaValidator_0040f210;
  this->fMemoryManager = manager;
  this->fSchemaGrammar = (SchemaGrammar *)0x0;
  this->fGrammarResolver = (GrammarResolver *)0x0;
  *(undefined8 *)((long)&this->fGrammarResolver + 2) = 0;
  *(undefined8 *)((long)&this->fXsiType + 2) = 0;
  this->fCurrentDatatypeValidator = (DatatypeValidator *)0x0;
  this->fNotationBuf = (XMLBuffer *)0x0;
  (this->fDatatypeBuffer).fIndex = 0;
  (this->fDatatypeBuffer).fCapacity = 0x3ff;
  (this->fDatatypeBuffer).fFullSize = 0;
  (this->fDatatypeBuffer).fUsed = false;
  (this->fDatatypeBuffer).fMemoryManager = manager;
  (this->fDatatypeBuffer).fFullHandler = (XMLBufferFullHandler *)0x0;
  (this->fDatatypeBuffer).fBuffer = (XMLCh *)0x0;
  iVar2 = (*manager->_vptr_MemoryManager[3])(manager);
  (this->fDatatypeBuffer).fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar2);
  *(XMLCh *)CONCAT44(extraout_var,iVar2) = L'\0';
  this->fTrailing = false;
  this->fSeenNonWhiteSpace = false;
  this->fSeenId = false;
  XSDErrorReporter::XSDErrorReporter(&this->fSchemaErrorReporter,(XMLErrorReporter *)0x0);
  this->fTypeStack = (ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)0x0;
  this->fMostRecentAttrValidator = (DatatypeValidator *)0x0;
  this->fErrorOccurred = false;
  this->fElemIsSpecified = false;
  pVVar3 = (ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)
           XMemory::operator_new(0x30,this->fMemoryManager);
  pMVar1 = this->fMemoryManager;
  (pVVar3->fVector).fCallDestructor = false;
  (pVVar3->fVector).fCurCount = 0;
  (pVVar3->fVector).fMaxCount = 8;
  (pVVar3->fVector).fElemList = (ComplexTypeInfo **)0x0;
  (pVVar3->fVector).fMemoryManager = pMVar1;
  iVar2 = (*pMVar1->_vptr_MemoryManager[3])();
  (pVVar3->fVector).fElemList = (ComplexTypeInfo **)CONCAT44(extraout_var_00,iVar2);
  memset((ComplexTypeInfo **)CONCAT44(extraout_var_00,iVar2),0,(pVVar3->fVector).fMaxCount << 3);
  this->fTypeStack = pVVar3;
  return;
}

Assistant:

SchemaValidator::SchemaValidator( XMLErrorReporter* const errReporter
                                , MemoryManager* const    manager) :

    XMLValidator(errReporter)
    , fMemoryManager(manager)
    , fSchemaGrammar(0)
    , fGrammarResolver(0)
    , fXsiType(0)
    , fNil(false)
    , fNilFound(false)
    , fCurrentDatatypeValidator(0)
    , fNotationBuf(0)
    , fDatatypeBuffer(1023, manager)
    , fTrailing(false)
    , fSeenNonWhiteSpace(false)
    , fSeenId(false)
    , fTypeStack(0)
    , fMostRecentAttrValidator(0)
    , fErrorOccurred(false)
    , fElemIsSpecified(false)
{
    fTypeStack = new (fMemoryManager) ValueStackOf<ComplexTypeInfo*>(8, fMemoryManager);
}